

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

void __thiscall CFG::CFG(CFG *this,Addr addr,unsigned_long_long execs)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_CFG = (_func_int **)&PTR__CFG_0012a940;
  this->m_addr = addr;
  this->m_status = UNCHECKED;
  (this->m_functionName)._M_dataplus._M_p = (pointer)&(this->m_functionName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_functionName,"unknown","");
  this->m_complete = false;
  this->m_execs = execs;
  p_Var1 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->m_entryNode = (CfgNode *)0x0;
  this->m_exitNode = (CfgNode *)0x0;
  this->m_haltNode = (CfgNode *)0x0;
  (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_edges)._M_t._M_impl.super__Rb_tree_header;
  (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_succs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_succs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_succs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_succs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_succs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_succs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_preds)._M_t._M_impl.super__Rb_tree_header;
  (this->m_preds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_preds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_preds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_preds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_preds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

CFG::CFG(Addr addr, unsigned long long execs) : m_addr(addr), m_status(CFG::UNCHECKED),
		m_functionName("unknown"), m_complete(false),
		m_entryNode(0), m_exitNode(0), m_haltNode(0), m_execs(execs) {
}